

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpegtran.c
# Opt level: O3

void usage(void)

{
  fprintf(_stderr,"usage: %s [switches] ",progname);
  fwrite("[inputfile]\n",0xc,1,_stderr);
  fwrite("Switches (names may be abbreviated):\n",0x25,1,_stderr);
  fwrite("  -copy none     Copy no extra markers from source file\n",0x38,1,_stderr);
  fwrite("  -copy comments Copy only comment markers (default)\n",0x35,1,_stderr);
  fwrite("  -copy icc      Copy only ICC profile markers\n",0x2f,1,_stderr);
  fwrite("  -copy all      Copy all extra markers\n",0x28,1,_stderr);
  fwrite("  -optimize      Optimize Huffman table (smaller file, but slow compression)\n",0x4d,1,
         _stderr);
  fwrite("  -progressive   Create progressive JPEG file\n",0x2e,1,_stderr);
  fwrite("Switches for modifying the image:\n",0x22,1,_stderr);
  fwrite("  -crop WxH+X+Y  Crop to a rectangular region\n",0x2e,1,_stderr);
  fwrite("  -drop +X+Y filename          Drop (insert) another image\n",0x3b,1,_stderr);
  fwrite("  -flip [horizontal|vertical]  Mirror image (left-right or top-bottom)\n",0x47,1,_stderr);
  fwrite("  -grayscale     Reduce to grayscale (omit color data)\n",0x37,1,_stderr);
  fwrite("  -perfect       Fail if there is non-transformable edge blocks\n",0x40,1,_stderr);
  fwrite("  -rotate [90|180|270]         Rotate image (degrees clockwise)\n",0x40,1,_stderr);
  fwrite("  -transpose     Transpose image\n",0x21,1,_stderr);
  fwrite("  -transverse    Transverse transpose image\n",0x2c,1,_stderr);
  fwrite("  -trim          Drop non-transformable edge blocks\n",0x34,1,_stderr);
  fwrite("                 with -drop: Requantize drop file to match source file\n",0x47,1,_stderr);
  fwrite("  -wipe WxH+X+Y  Wipe (gray out) a rectangular region\n",0x36,1,_stderr);
  fwrite("Switches for advanced users:\n",0x1d,1,_stderr);
  fwrite("  -arithmetic    Use arithmetic coding\n",0x27,1,_stderr);
  fwrite("  -icc FILE      Embed ICC profile contained in FILE\n",0x35,1,_stderr);
  fwrite("  -restart N     Set restart interval in rows, or in blocks with B\n",0x43,1,_stderr);
  fwrite("  -maxmemory N   Maximum memory to use (in kbytes)\n",0x33,1,_stderr);
  fwrite("  -maxscans N    Maximum number of scans to allow in input file\n",0x40,1,_stderr);
  fwrite("  -outfile name  Specify name for output file\n",0x2e,1,_stderr);
  fwrite("  -report        Report transformation progress\n",0x30,1,_stderr);
  fwrite("  -strict        Treat all warnings as fatal\n",0x2d,1,_stderr);
  fwrite("  -verbose  or  -debug   Emit debug output\n",0x2b,1,_stderr);
  fwrite("  -version       Print version information and exit\n",0x34,1,_stderr);
  fwrite("Switches for wizards:\n",0x16,1,_stderr);
  fwrite("  -scans FILE    Create multi-scan JPEG per script FILE\n",0x38,1,_stderr);
  exit(1);
}

Assistant:

LOCAL(void)
usage(void)
/* complain about bad command line */
{
  fprintf(stderr, "usage: %s [switches] ", progname);
#ifdef TWO_FILE_COMMANDLINE
  fprintf(stderr, "inputfile outputfile\n");
#else
  fprintf(stderr, "[inputfile]\n");
#endif

  fprintf(stderr, "Switches (names may be abbreviated):\n");
  fprintf(stderr, "  -copy none     Copy no extra markers from source file\n");
  fprintf(stderr, "  -copy comments Copy only comment markers (default)\n");
  fprintf(stderr, "  -copy icc      Copy only ICC profile markers\n");
  fprintf(stderr, "  -copy all      Copy all extra markers\n");
#ifdef ENTROPY_OPT_SUPPORTED
  fprintf(stderr, "  -optimize      Optimize Huffman table (smaller file, but slow compression)\n");
#endif
#ifdef C_PROGRESSIVE_SUPPORTED
  fprintf(stderr, "  -progressive   Create progressive JPEG file\n");
#endif
  fprintf(stderr, "Switches for modifying the image:\n");
#if TRANSFORMS_SUPPORTED
  fprintf(stderr, "  -crop WxH+X+Y  Crop to a rectangular region\n");
  fprintf(stderr, "  -drop +X+Y filename          Drop (insert) another image\n");
  fprintf(stderr, "  -flip [horizontal|vertical]  Mirror image (left-right or top-bottom)\n");
  fprintf(stderr, "  -grayscale     Reduce to grayscale (omit color data)\n");
  fprintf(stderr, "  -perfect       Fail if there is non-transformable edge blocks\n");
  fprintf(stderr, "  -rotate [90|180|270]         Rotate image (degrees clockwise)\n");
#endif
#if TRANSFORMS_SUPPORTED
  fprintf(stderr, "  -transpose     Transpose image\n");
  fprintf(stderr, "  -transverse    Transverse transpose image\n");
  fprintf(stderr, "  -trim          Drop non-transformable edge blocks\n");
  fprintf(stderr, "                 with -drop: Requantize drop file to match source file\n");
  fprintf(stderr, "  -wipe WxH+X+Y  Wipe (gray out) a rectangular region\n");
#endif
  fprintf(stderr, "Switches for advanced users:\n");
#ifdef C_ARITH_CODING_SUPPORTED
  fprintf(stderr, "  -arithmetic    Use arithmetic coding\n");
#endif
  fprintf(stderr, "  -icc FILE      Embed ICC profile contained in FILE\n");
  fprintf(stderr, "  -restart N     Set restart interval in rows, or in blocks with B\n");
  fprintf(stderr, "  -maxmemory N   Maximum memory to use (in kbytes)\n");
  fprintf(stderr, "  -maxscans N    Maximum number of scans to allow in input file\n");
  fprintf(stderr, "  -outfile name  Specify name for output file\n");
  fprintf(stderr, "  -report        Report transformation progress\n");
  fprintf(stderr, "  -strict        Treat all warnings as fatal\n");
  fprintf(stderr, "  -verbose  or  -debug   Emit debug output\n");
  fprintf(stderr, "  -version       Print version information and exit\n");
  fprintf(stderr, "Switches for wizards:\n");
#ifdef C_MULTISCAN_FILES_SUPPORTED
  fprintf(stderr, "  -scans FILE    Create multi-scan JPEG per script FILE\n");
#endif
  exit(EXIT_FAILURE);
}